

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperRefs.c
# Opt level: O3

void Map_MappingEstimateRefsInit(Map_Man_t *p)

{
  Map_Node_t **ppMVar1;
  Map_Node_t *pMVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  
  lVar3 = (long)p->vMapObjs->nSize;
  if (0 < lVar3) {
    ppMVar1 = p->vMapObjs->pArray;
    lVar4 = 0;
    do {
      pMVar2 = ppMVar1[lVar4];
      fVar5 = (float)pMVar2->nRefs;
      pMVar2->nRefEst[2] = fVar5;
      pMVar2->nRefEst[1] = fVar5;
      pMVar2->nRefEst[0] = fVar5;
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  return;
}

Assistant:

void Map_MappingEstimateRefsInit( Map_Man_t * p )
{
    Map_Node_t * pNode;
    int i;
    for ( i = 0; i < p->vMapObjs->nSize; i++ )
    {
        pNode = p->vMapObjs->pArray[i];
//        pNode->nRefEst[0] = pNode->nRefEst[1] = ((float)pNode->nRefs)*(float)2.0;
        pNode->nRefEst[0] = pNode->nRefEst[1] = pNode->nRefEst[2] = ((float)pNode->nRefs);
    }
}